

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

int Cloud_SharingSize(CloudManager *dd,CloudNode **pn,int nn)

{
  int iVar1;
  int iVar2;
  CloudNode *n;
  ulong uVar3;
  
  if (nn < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    n = (CloudNode *)pn;
    do {
      iVar1 = cloudDagSize((CloudManager *)((ulong)pn[uVar3] & 0xfffffffffffffffe),n);
      iVar2 = iVar2 + iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)nn != uVar3);
    if (0 < nn) {
      uVar3 = 0;
      do {
        cloudClearMark((CloudManager *)((ulong)pn[uVar3] & 0xfffffffffffffffe),n);
        uVar3 = uVar3 + 1;
      } while ((uint)nn != uVar3);
    }
  }
  return iVar2;
}

Assistant:

int Cloud_SharingSize( CloudManager * dd, CloudNode ** pn, int nn )
{
    int res, i;
    res = 0;
    for ( i = 0; i < nn; i++ )
        res += cloudDagSize( dd, Cloud_Regular( pn[i] ) );
    for ( i = 0; i < nn; i++ )
        cloudClearMark( dd, Cloud_Regular( pn[i] ) );
    return res;
}